

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O3

void __thiscall Cgmres<Model>::Ax_func(Cgmres<Model> *this,double *Ax,double *dUdt)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  int16_t i;
  double U_buf [300];
  double local_978 [301];
  
  lVar3 = 0;
  do {
    dVar2 = (dUdt + lVar3)[1];
    local_978[lVar3] = dUdt[lVar3] * 0.002;
    local_978[lVar3 + 1] = dVar2 * 0.002;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 300);
  pdVar1 = this->U;
  lVar3 = 0;
  do {
    local_978[lVar3] = local_978[lVar3] + pdVar1[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 300);
  F_func(this,Ax,local_978,this->x_dxh,this->t + 0.002);
  pdVar1 = this->F_dxh_h;
  lVar3 = 0;
  do {
    Ax[lVar3] = Ax[lVar3] - pdVar1[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 300);
  lVar3 = 0;
  do {
    dVar2 = (Ax + lVar3)[1];
    Ax[lVar3] = Ax[lVar3] * 500.0;
    (Ax + lVar3)[1] = dVar2 * 500.0;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 300);
  return;
}

Assistant:

void Ax_func(double* Ax, const double* dUdt) override {
    double U_buf[len];

    // F(U + dUdt * h, x + dxdt * h, t + h)
    mul(U_buf, dUdt, h, len);
    add(U_buf, U_buf, U, len);
    F_func(Ax, U_buf, x_dxh, t + h);

    // Ax = (F(U + dUdt * h, x + dxdt * h, t + h) - F(U, x + dxdt * h, t + h)) / h
    sub(Ax, Ax, F_dxh_h, len);
    div(Ax, Ax, h, len);
  }